

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

osfildef * osfdup(osfildef *orig,char *mode)

{
  char cVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  undefined1 *puVar5;
  FILE *pFVar6;
  char *pcVar7;
  undefined1 local_2a;
  undefined1 local_29;
  
  cVar1 = *mode;
  if (cVar1 != '\0') {
    pcVar7 = mode + 1;
    cVar2 = cVar1;
    do {
      pvVar4 = memchr("rw+bst",(int)cVar2,7);
      if (pvVar4 == (void *)0x0) {
        return (osfildef *)0x0;
      }
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar2 != '\0');
    if ((cVar1 == 'w') || (cVar1 == 'r')) {
      if (mode[1] == '+') {
        puVar5 = &local_2a;
      }
      else {
        puVar5 = &local_29;
        if ((cVar1 != 'w') && (cVar1 != 'r')) {
          return (osfildef *)0x0;
        }
      }
      *puVar5 = 0;
      iVar3 = fileno((FILE *)orig);
      iVar3 = dup(iVar3);
      pFVar6 = fdopen(iVar3,mode);
      return (osfildef *)pFVar6;
    }
  }
  return (osfildef *)0x0;
}

Assistant:

osfildef*
osfdup(osfildef *orig, const char *mode)
{
    char realmode[5];
    char *p = realmode;
    const char *m;

    /* verify that there aren't any unrecognized mode flags */
    for (m = mode ; *m != '\0' ; ++m)
    {
        if (strchr("rw+bst", *m) == 0)
            return 0;
    }

    /* figure the read/write mode - translate r+ and w+ to r+ */
    if ((mode[0] == 'r' || mode[0] == 'w') && mode[1] == '+')
        *p++ = 'r', *p++ = '+';
    else if (mode[0] == 'r')
        *p++ = 'r';
    else if (mode[0] == 'w')
        *p++ = 'w';
    else
        return 0;

    /* end the mode string */
    *p = '\0';

    /* duplicate the handle in the given mode */
    return fdopen(dup(fileno(orig)), mode);
}